

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O1

SampledWavelengths *
pbrt::SampledWavelengths::SampleXYZ(SampledWavelengths *__return_storage_ptr__,Float u)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int i;
  long lVar4;
  float fVar5;
  undefined1 auVar6 [64];
  float fVar7;
  undefined1 extraout_var [60];
  
  *__return_storage_ptr__ = (SampledWavelengths)ZEXT1232(ZEXT812(0));
  lVar4 = 0;
  do {
    fVar5 = (float)(int)lVar4 * 0.25 + u;
    uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar5),ZEXT416(0x3f800000),0xe);
    bVar2 = (bool)((byte)uVar1 & 1);
    auVar3 = vfmadd132ss_fma(ZEXT416((uint)bVar2 * (int)(fVar5 + -1.0) + (uint)!bVar2 * (int)fVar5),
                             SUB6416(ZEXT464(0x3f5b5e7f),0),ZEXT416(0xbfe9eb96));
    auVar6._0_4_ = atanhf(auVar3._0_4_);
    auVar6._4_60_ = extraout_var;
    auVar3 = vfmadd132ss_fma(auVar6._0_16_,SUB6416(ZEXT464(0x44068000),0),ZEXT416(0xc30ae38e));
    fVar5 = auVar3._0_4_;
    (__return_storage_ptr__->lambda).values[lVar4] = fVar5;
    fVar7 = 0.0;
    if ((360.0 <= fVar5) && (fVar5 <= 830.0)) {
      fVar5 = coshf((fVar5 + -538.0) * 0.0072);
      fVar7 = 0.003939804 / (fVar5 * fVar5);
    }
    (__return_storage_ptr__->pdf).values[lVar4] = fVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return __return_storage_ptr__;
}

Assistant:

SampleXYZ(Float u) {
        SampledWavelengths swl;
        for (int i = 0; i < NSpectrumSamples; ++i) {
            // Compute _up_ for $i$th wavelength sample
            Float up = u + Float(i) / NSpectrumSamples;
            if (up > 1)
                up -= 1;

            swl.lambda[i] = SampleXYZMatching(up);
            swl.pdf[i] = XYZMatchingPDF(swl.lambda[i]);
        }
        return swl;
    }